

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateForwardDeclarations
          (FileGenerator *this,Printer *printer)

{
  FileDescriptor *pFVar1;
  int index;
  ForwardDeclarations decls;
  FileGenerator dependency;
  ForwardDeclarations FStack_2c8;
  FileGenerator local_238;
  
  FStack_2c8.namespaces_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FStack_2c8.namespaces_._M_t._M_impl.super__Rb_tree_header._M_header;
  index = 0;
  FStack_2c8.namespaces_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FStack_2c8.namespaces_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FStack_2c8.namespaces_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FStack_2c8.classes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FStack_2c8.classes_._M_t._M_impl.super__Rb_tree_header._M_header;
  FStack_2c8.classes_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FStack_2c8.classes_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FStack_2c8.classes_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FStack_2c8.enums_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FStack_2c8.enums_._M_t._M_impl.super__Rb_tree_header._M_header;
  FStack_2c8.enums_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FStack_2c8.enums_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FStack_2c8.enums_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar1 = this->file_;
  FStack_2c8.namespaces_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FStack_2c8.namespaces_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FStack_2c8.classes_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FStack_2c8.classes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FStack_2c8.enums_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FStack_2c8.enums_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(pFVar1 + 0x18)) {
    do {
      pFVar1 = FileDescriptor::dependency(pFVar1,index);
      FileGenerator(&local_238,pFVar1,&this->options_);
      FillForwardDeclarations(&local_238,&FStack_2c8);
      ~FileGenerator(&local_238);
      index = index + 1;
      pFVar1 = this->file_;
    } while (index < *(int *)(pFVar1 + 0x18));
  }
  FillForwardDeclarations(this,&FStack_2c8);
  ForwardDeclarations::Print(&FStack_2c8,printer,&this->options_);
  ForwardDeclarations::~ForwardDeclarations(&FStack_2c8);
  return;
}

Assistant:

void FileGenerator::GenerateForwardDeclarations(io::Printer* printer) {
  ForwardDeclarations decls;
  for (int i = 0; i < file_->dependency_count(); i++) {
    FileGenerator dependency(file_->dependency(i), options_);
    dependency.FillForwardDeclarations(&decls);
  }
  FillForwardDeclarations(&decls);
  decls.Print(printer, options_);
}